

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<unsigned_long,char[18],char_const*,char[45]>
          (string *__return_storage_ptr__,Diligent *this,unsigned_long *Args,char (*Args_1) [18],
          char **Args_2,char (*Args_3) [45])

{
  stringstream ss;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  FormatStrSS<std::__cxx11::stringstream,char[18],char_const*,char[45]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [18])Args,(char **)Args_1,(char (*) [45])Args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}